

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_vmt84.c
# Opt level: O3

void gga_x_vmt84_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long extraout_RDX;
  long lVar9;
  long in_RSI;
  long *plVar10;
  long *in_R8;
  ulong uVar11;
  undefined8 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  
  plVar10 = (long *)0x10;
  puVar5 = (undefined8 *)malloc(0x10);
  p->params = puVar5;
  uVar3 = p->info->number;
  uVar7 = (ulong)uVar3;
  if (uVar3 == 0x45) {
    uVar12 = 0x3fcc19110e80c25e;
    uVar19 = 0x3f13660e51d25aab;
  }
  else {
    if (uVar3 != 0x44) {
      gga_x_vmt84_init_cold_1();
      if (in_RSI != 0) {
        lVar9 = 0;
        do {
          lVar6 = (int)plVar10[9] * lVar9;
          dVar13 = *(double *)(extraout_RDX + lVar6 * 8);
          if ((int)plVar10[1] == 2) {
            dVar13 = dVar13 + *(double *)(extraout_RDX + 8 + lVar6 * 8);
          }
          dVar18 = (double)plVar10[0x30];
          if (dVar18 <= dVar13) {
            dVar13 = *(double *)(extraout_RDX + lVar6 * 8);
            if (dVar13 <= dVar18) {
              dVar13 = dVar18;
            }
            dVar14 = (double)plVar10[0x32] * (double)plVar10[0x32];
            dVar1 = *(double *)(uVar7 + *(int *)((long)plVar10 + 0x4c) * lVar9 * 8);
            if (dVar1 <= dVar14) {
              dVar1 = dVar14;
            }
            pdVar4 = (double *)plVar10[0x2f];
            dVar14 = (double)plVar10[0x31];
            dVar15 = cbrt(dVar13);
            dVar2 = *pdVar4;
            dVar16 = cbrt(9.869604401089358);
            dVar22 = dVar13 * dVar13;
            dVar23 = dVar15 * dVar15 * dVar22;
            auVar25._8_8_ = dVar23;
            auVar25._0_8_ = dVar16 * dVar16;
            auVar25 = divpd(_DAT_0101f460,auVar25);
            dVar24 = auVar25._0_8_;
            dVar20 = auVar25._8_8_ * dVar1 * 1.5874010519681996;
            dVar17 = exp((pdVar4[1] * -1.8171205928321397 * dVar24 * dVar20) / 24.0);
            dVar22 = exp((pdVar4[1] * -3.3019272488946267 * ((1.0 / dVar16) / 9.869604401089358) *
                          dVar1 * dVar1 * 1.2599210498948732 *
                         ((1.0 / dVar15) / (dVar22 * dVar22 * dVar13))) / 288.0);
            dVar21 = 0.0;
            if (dVar18 < dVar13 * 0.5) {
              dVar13 = (double)(-(ulong)(dVar14 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar14 < 1.0) & (ulong)(dVar14 + -1.0 + 1.0));
              uVar11 = -(ulong)(dVar13 <= dVar14);
              dVar13 = (double)(uVar11 & (ulong)dVar14 | ~uVar11 & (ulong)dVar13);
              dVar18 = cbrt(dVar13);
              dVar14 = (1.0 - dVar22) * 3.3019272488946267 * dVar16 * dVar16;
              dVar21 = dVar15 * dVar18 * dVar13 * -0.36927938319101117 *
                       (dVar23 * (1.0 / dVar1) * 1.2599210498948732 * (dVar14 + dVar14) +
                        (dVar17 * (1.0 / ((dVar20 * dVar2 * 1.8171205928321397 * dVar24) / 24.0 +
                                         1.0)) * auVar25._8_8_ * 1.5874010519681996 *
                        dVar2 * 1.8171205928321397 * dVar1 * dVar24) / 24.0 + dVar22);
              dVar21 = dVar21 + dVar21;
            }
            lVar6 = *in_R8;
            if ((lVar6 != 0) && ((*(byte *)(*plVar10 + 0x40) & 1) != 0)) {
              lVar8 = (int)plVar10[0xb] * lVar9;
              *(double *)(lVar6 + lVar8 * 8) = dVar21 + *(double *)(lVar6 + lVar8 * 8);
            }
          }
          lVar9 = lVar9 + 1;
        } while (in_RSI != lVar9);
      }
      return;
    }
    uVar12 = 0x3fbf9add3c0ca458;
    uVar19 = 0x3ef81e03f705857b;
  }
  *puVar5 = uVar12;
  puVar5[1] = uVar19;
  return;
}

Assistant:

static void
gga_x_vmt84_init(xc_func_type *p)
{
  gga_x_vmt84_params *params;

  assert(p != NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_vmt84_params));
  params = (gga_x_vmt84_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_VMT84_PBE:
    params->mu    = 0.2195149727645171;
    params->alpha = 0.000074;
    break;
  case XC_GGA_X_VMT84_GE:
    params->mu = 10.0/81.0;
    params->alpha = 0.000023;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_vmt84\n");
    exit(1);
  }
}